

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cc
# Opt level: O0

undefined8
load_string_abi_cxx11_
          (bool use_colors,bool use_powerline_left,bool use_powerline_right,short num_averages)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  double *__loadavg;
  int iVar4;
  undefined7 in_register_00000039;
  ushort in_R8W;
  float fVar5;
  double adStackY_200 [2];
  ostream *local_1f0;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int local_1bc;
  float avg;
  int i;
  uint load_percent;
  unsigned_long __vla_expr0;
  long local_190;
  ostringstream ss;
  undefined1 uStack_15d;
  POWERLINE_DIRECTION PStack_15c;
  undefined8 auStack_158 [40];
  ushort local_16;
  byte local_13;
  byte local_12;
  byte local_11;
  short num_averages_local;
  bool use_powerline_right_local;
  bool use_powerline_left_local;
  undefined8 uStack_10;
  bool use_colors_local;
  
  local_13 = (byte)num_averages & 1;
  adStackY_200[0] = 5.27428910773614e-318;
  local_16 = in_R8W;
  local_12 = use_powerline_right;
  local_11 = use_powerline_left;
  uStack_10 = CONCAT71(in_register_00000039,use_colors);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  adStackY_200[0] = 5.27445709005573e-318;
  std::ios_base::setf((ios_base *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      (fmtflags)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                      (fmtflags)in_stack_fffffffffffffe18);
  adStackY_200[0] = 5.27461025040594e-318;
  std::ios_base::precision((ios_base *)((long)&local_190 + *(long *)(local_190 + -0x18)),2);
  lVar2 = -(ulong)((uint)local_16 * 8 + 0xf & 0xfffffff0);
  __loadavg = (double *)((long)adStackY_200 + lVar2 + 8);
  if (((short)local_16 < 1) || (3 < (short)local_16)) {
    *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104aa0;
    std::operator<<((ostream *)&local_190,'\0');
    *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104ab5;
    std::__cxx11::ostringstream::str();
  }
  else {
    iVar4 = (int)(short)local_16;
    *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104af9;
    iVar4 = getloadavg(__loadavg,iVar4);
    if (iVar4 < 0) {
      *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104b11;
      std::operator<<((ostream *)&local_190," 0.00 0.00 0.00");
    }
    else {
      *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104b30;
      get_cpu_count();
      if ((local_11 & 1) != 0) {
        if ((local_13 & 1) == 0) {
          if ((local_12 & 1) == 0) {
            *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104c17;
            powerline(*(ostringstream **)((long)auStack_158 + lVar2 + 8),
                      *(char **)((long)auStack_158 + lVar2),
                      *(POWERLINE_DIRECTION *)((long)auStack_158 + lVar2 + -4),
                      (bool)(&uStack_15d)[lVar2]);
          }
          else {
            *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104bef;
            powerline(*(ostringstream **)((long)auStack_158 + lVar2 + 8),
                      *(char **)((long)auStack_158 + lVar2),
                      *(POWERLINE_DIRECTION *)((long)auStack_158 + lVar2 + -4),
                      (bool)(&uStack_15d)[lVar2]);
          }
        }
        else {
          *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104bbe;
          powerline(*(ostringstream **)((long)auStack_158 + lVar2 + 8),
                    *(char **)((long)auStack_158 + lVar2),
                    *(POWERLINE_DIRECTION *)((long)auStack_158 + lVar2 + -4),
                    (bool)(&uStack_15d)[lVar2]);
        }
      }
      *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104c30;
      std::operator<<((ostream *)&local_190,' ');
      for (local_1bc = 0; local_1bc < (short)local_16; local_1bc = local_1bc + 1) {
        dVar1 = __loadavg[local_1bc];
        *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104c8a;
        fVar5 = floorf((float)dVar1 * 100.0 + 0.5);
        if (local_1bc == (short)local_16 + -1) {
          *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104cc3;
          std::ostream::operator<<(&local_190,fVar5 / 100.0);
        }
        else {
          *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104cdb;
          poVar3 = (ostream *)std::ostream::operator<<(&local_190,fVar5 / 100.0);
          local_1f0 = poVar3;
          *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104cf7;
          std::operator<<(poVar3," ");
        }
      }
      if ((local_11 & 1) != 0) {
        if ((local_12 & 1) == 0) {
          if ((local_13 & 1) == 0) {
            *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104d7d;
            std::operator<<((ostream *)&local_190,"#[fg=default,bg=default]");
          }
        }
        else {
          *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104d44;
          powerline(*(ostringstream **)((long)auStack_158 + lVar2 + 8),
                    *(char **)((long)auStack_158 + lVar2),
                    *(POWERLINE_DIRECTION *)((long)auStack_158 + lVar2 + -4),
                    (bool)(&uStack_15d)[lVar2]);
          *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104d60;
          powerline(*(ostringstream **)((long)auStack_158 + lVar2 + 8),
                    *(char **)((long)auStack_158 + lVar2),
                    *(POWERLINE_DIRECTION *)((long)auStack_158 + lVar2 + -4),
                    (bool)(&uStack_15d)[lVar2]);
        }
      }
    }
    *(undefined8 *)((long)adStackY_200 + lVar2) = 0x104d9a;
    std::__cxx11::ostringstream::str();
  }
  adStackY_200[0] = 5.27897285005872e-318;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return CONCAT71(in_register_00000039,use_colors);
}

Assistant:

std::string load_string( bool use_colors,
  bool use_powerline_left, bool use_powerline_right,
  short num_averages )
{
  std::ostringstream ss;
  ss.setf( std::ios::fixed, std::ios::floatfield );
  ss.precision( 2 );
  double averages[num_averages];
  // based on: opensource.apple.com/source/Libc/Libc-262/gen/getloadavg.c

  if( num_averages <= 0 || num_averages > 3)
  {
    ss << (char) 0;
    return ss.str();
  }

  if( getloadavg( averages, num_averages ) < 0 )
  {
    ss << " 0.00 0.00 0.00"; // couldn't get averages.
  }
  else
  {
    unsigned load_percent = static_cast<unsigned int>( averages[0] /
        get_cpu_count() * 0.5f * 100.0f );

    if( load_percent > 100 )
    {
      load_percent = 100;
    }
    if( use_colors )
    {
      if( use_powerline_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_RIGHT );
      }
      else if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT );
      }
      else
      {
        powerline( ss, load_lut[load_percent], NONE );
      }
    }

    ss << ' ';
    for( int i = 0; i < num_averages; ++i )
    {
      // Round to nearest, make sure this is only a 0.00 value not a 0.0000
      float avg = floorf( static_cast<float>( averages[i] ) * 100 + 0.5 ) / 100;
      // Don't print trailing whitespace for last element
      if ( i == num_averages-1 )
      {
        ss << avg;
      }
      else
      {
        ss << avg << " ";
      }
    }

    if( use_colors )
    {
      if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline( ss, "#[fg=default,bg=default]", POWERLINE_LEFT );
      }
      else if( !use_powerline_right )
      {
        ss << "#[fg=default,bg=default]";
      }
    }
  }

  return ss.str();
}